

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O0

lyplg_ext_record * lyplg_ext_record_find(ly_ctx *ctx,char *module,char *revision,char *name)

{
  undefined8 local_30;
  lyplg_ext_record *record;
  char *name_local;
  char *revision_local;
  char *module_local;
  ly_ctx *ctx_local;
  
  local_30 = (lyplg_ext_record *)0x0;
  if (ctx != (ly_ctx *)0x0) {
    local_30 = (lyplg_ext_record *)lyplg_record_find(ctx,LYPLG_EXTENSION,module,revision,name);
  }
  if (local_30 == (lyplg_ext_record *)0x0) {
    local_30 = (lyplg_ext_record *)
               lyplg_record_find((ly_ctx *)0x0,LYPLG_EXTENSION,module,revision,name);
  }
  return local_30;
}

Assistant:

struct lyplg_ext_record *
lyplg_ext_record_find(const struct ly_ctx *ctx, const char *module, const char *revision, const char *name)
{
    struct lyplg_ext_record *record = NULL;

    if (ctx) {
        /* try to find context specific plugin */
        record = lyplg_record_find(ctx, LYPLG_EXTENSION, module, revision, name);
    }

    if (!record) {
        /* try to find shared plugin */
        record = lyplg_record_find(NULL, LYPLG_EXTENSION, module, revision, name);
    }

    return record;
}